

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int jump_label(char *src,char *base)

{
  ushort uVar1;
  long lVar2;
  byte bVar3;
  short sVar4;
  
  bVar3 = *src;
  while (bVar3 != 0) {
    if (bVar3 < 0x40) {
      sVar4 = 0;
      do {
        sVar4 = sVar4 + (ushort)bVar3 + 1;
        lVar2 = (long)sVar4;
        bVar3 = src[lVar2];
        if (bVar3 == 0) goto LAB_00103804;
      } while (bVar3 < 0x40);
    }
    else {
      lVar2 = 0;
    }
    uVar1 = (*(ushort *)(src + lVar2) & 0xff3f) << 8 | *(ushort *)(src + lVar2) >> 8;
    src = base + uVar1;
    bVar3 = base[uVar1];
  }
  lVar2 = 0;
LAB_00103804:
  return (int)lVar2;
}

Assistant:

int jump_label(char *src, char *base){
  short now = 0;
  short i = 0;
  short next = 0;
  while (src[now] != 0) {
    // printf("%d ",now);fflush(stdout);
    if (is_compress(src[now])) {
      unsigned short pos =
          get_compress_pos(ntohs(*(const unsigned short *)(src + now)));
      // printf("pos=%d ",pos);fflush(stdout);
      next = now + 2;
      return jump_label(base + pos, base);
    } else {
      // printf(" bbb ");fflush(stdout);
      now += src[now] + 1;
    }
  }
  next = now;
  return next;
}